

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O1

Item * protect_astmt(Item *q1,Item *q2)

{
  Item *pIVar1;
  
  replacstr(q1,"#pragma acc atomic update\n");
  pIVar1 = insertstr(q2->next,"\n");
  protect_include_ = 1;
  return pIVar1;
}

Assistant:

Item* protect_astmt(Item* q1, Item* q2) { /* PROTECT, ';' */
	Item* q;
	replacstr(q1, "#pragma acc atomic update\n");
	q = insertstr(q2->next, "\n");
	protect_include_ = 1;
	return q;
}